

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O0

void __thiscall MedianFilterCV_8U::filterImageEdges(MedianFilterCV_8U *this,Mat *image)

{
  uchar uVar1;
  uchar *puVar2;
  int local_9c;
  int local_98;
  int j;
  int i;
  int iStack_8c;
  uchar array [6];
  int x;
  int y;
  int position;
  int *range;
  int (*__end1) [4];
  int (*__begin1) [4];
  int (*__range1) [4] [4];
  int local_58;
  int iStack_54;
  uchar tempMedian;
  int ranges [4] [4];
  Mat *image_local;
  MedianFilterCV_8U *this_local;
  
  local_58 = 0;
  iStack_54 = 0;
  ranges[0][0] = 0;
  ranges[0][1] = *(int *)(image + 0xc) + -1;
  ranges[0][2] = 1;
  ranges[0][3] = *(int *)(image + 8) + -1;
  ranges[1][0] = 0;
  ranges[1][1] = 0;
  ranges[1][2] = *(int *)(image + 8) + -1;
  ranges[1][3] = *(int *)(image + 8) + -1;
  ranges[2][0] = 0;
  ranges[2][1] = *(int *)(image + 0xc) + -1;
  ranges[2][2] = 1;
  ranges[2][3] = *(int *)(image + 8) + -1;
  ranges[3][0] = *(int *)(image + 0xc) + -1;
  ranges[3][1] = *(int *)(image + 0xc) + -1;
  ranges[3]._8_8_ = image;
  for (__end1 = (int (*) [4])&local_58; __end1 != (int (*) [4])(ranges[3] + 2); __end1 = __end1 + 1)
  {
    for (array._2_4_ = (*__end1)[0]; (int)array._2_4_ <= (*__end1)[1]; array._2_4_ = array._2_4_ + 1
        ) {
      for (iStack_8c = (*__end1)[2]; iStack_8c <= (*__end1)[3]; iStack_8c = iStack_8c + 1) {
        i._2_1_ = 0;
        i._3_1_ = 0xff;
        x = 0;
        for (local_98 = array._2_4_ + -1; local_98 <= array._2_4_ + 1; local_98 = local_98 + 1) {
          for (local_9c = iStack_8c + -1; local_9c <= iStack_8c + 1; local_9c = local_9c + 1) {
            if ((((-1 < local_98) && (-1 < local_9c)) && (local_98 < *(int *)(ranges[3]._8_8_ + 8)))
               && (local_9c < *(int *)(ranges[3]._8_8_ + 0xc))) {
              puVar2 = cv::Mat::at<unsigned_char>((Mat *)ranges[3]._8_8_,local_98,local_9c);
              *(uchar *)((long)&j + (long)x + 2) = *puVar2;
              x = x + 1;
            }
          }
        }
        sortThreeElements(this,(uchar *)((long)&j + 2));
        sortThreeElements(this,(uchar *)((long)&i + 1));
        uVar1 = getMedianOfTwoSortedArray(this,(uchar *)((long)&j + 2),3,(uchar *)((long)&i + 1),3);
        uVar1 = getActualPixel(this,uVar1,array._2_4_,iStack_8c);
        puVar2 = cv::Mat::at<unsigned_char>(this->resultImage,array._2_4_,iStack_8c);
        *puVar2 = uVar1;
      }
    }
  }
  return;
}

Assistant:

void MedianFilterCV_8U::filterImageEdges(const cv::Mat &image) {


    // Array of ranges to filter. Each range consists of two pairs.
    // The first and second is a range in y, third and fourth is a range in x.
    // For example {0, 0, 0, image.cols - 1} range specifying the first line
    int ranges[4][4] = {{0, 0, 0, image.cols - 1},
                        {1, image.rows - 1, 0, 0},
                        {image.rows - 1, image.rows - 1, 0, image.cols - 1},
                        {1, image.rows - 1, image.cols - 1, image.cols - 1}}; // 42 operations


    uchar tempMedian;                                                         // 1 operations
    // if first or last line (len = 1920)  (1 + 2 + 4 + 2 + 4 * 1920 + 1920 * (1 + 4 + 1 + 14 + 14 + ~80 + 63)) * 2 = 695052
    // if the first or last column (hei = 1080) (1 + 2 + 4 + 2 + 4 * 1078 + 1078 * (1 + 4 + 1 + 14 + 14 + ~80 + 63)) * 2 = 390254
    for (auto range : ranges) {                                               // 4 operations
        int position = 0;                                                     // 1 operation
        for (int y = range[0]; y <= range[1]; ++y) {                          // 2 operations + 4 at every step
            for (int x = range[2]; x <= range[3]; ++x) {                      // 2 operations + 4 at every step
                uchar array[6];                                               // 1 operation
                // Add 0 and 255 in case we are looking for a median in the corners.
                // Thus we process corner pixels as well as non-corner pixels
                array[4] = 0;                                                 // 2 operations
                array[5] = 255;                                               // 2 operations

                position = 0;                                                 // 1 operation
                for (int i = y - 1; i <= y + 1; ++i) {                        // 2 operations + 12
                    for (int j = x - 1; j <= x + 1; ++j) {                    // 2 operations + 12
                        if (i < 0 || j < 0 || i >= image.rows || j >= image.cols) { // 9 operations
                            continue;                                         // 1 operation
                        }

                        array[position++] = image.at<uchar>(i, j);            // 7 operations
                    }
                }

                // sort the first 3 and last 3 elements
                sortThreeElements(array);                                     // 1 operation + operations of sort
                sortThreeElements(array + 3);                                 // 2 operations + operations of sort

                tempMedian = getMedianOfTwoSortedArray(array, 3, array + 3, 3);// 3 operations
                resultImage->at<uchar>(y, x) = getActualPixel(tempMedian, y, x);// 3 operations
            }
        }
    }
}